

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus
debugCompareHighsInfo(HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus return_status;
  HighsInfo *in_stack_00000028;
  HighsOptions *in_stack_00000030;
  HighsInfo *in_stack_00000060;
  HighsInfo *in_stack_00000068;
  HighsOptions *in_stack_00000070;
  HighsInfo *in_stack_00000140;
  HighsInfo *in_stack_00000148;
  HighsOptions *in_stack_00000150;
  HighsDebugStatus in_stack_ffffffffffffffe0;
  HighsDebugStatus HVar1;
  
  HVar1 = kOk;
  debugCompareHighsInfoObjective(in_stack_00000030,in_stack_00000028,(HighsInfo *)options);
  HVar1 = debugWorseStatus(HVar1,in_stack_ffffffffffffffe0);
  debugCompareHighsInfoStatus(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  HVar1 = debugWorseStatus(HVar1,in_stack_ffffffffffffffe0);
  debugCompareHighsInfoInfeasibility(in_stack_00000150,in_stack_00000148,in_stack_00000140);
  HVar1 = debugWorseStatus(HVar1,in_stack_ffffffffffffffe0);
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfo(const HighsOptions& options,
                                       const HighsInfo& highs_info0,
                                       const HighsInfo& highs_info1) {
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  return_status = debugWorseStatus(
      debugCompareHighsInfoObjective(options, highs_info0, highs_info1),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoStatus(options, highs_info0, highs_info1),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoInfeasibility(options, highs_info0, highs_info1),
      return_status);
  return return_status;
}